

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

void set_wall_state(level *lev)

{
  long lVar1;
  int x;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  undefined8 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  
  pcVar6 = (char *)((long)lev[-1].wtails + 0xdc);
  lVar17 = 0;
  do {
    x = (int)lVar17;
    lVar1 = lVar17 + 1;
    iVar18 = x + 1;
    iVar14 = x + -1;
    uVar16 = 0;
    pcVar5 = pcVar6;
    do {
      uVar15 = (uint)uVar16;
      iVar13 = iVar18;
      iVar8 = x;
      iVar12 = iVar14;
      iVar3 = iVar18;
      uVar2 = uVar15;
      uVar19 = uVar16;
      switch(pcVar5[0x108]) {
      case '\x01':
        uVar2 = 0;
        goto LAB_0016c5ae;
      case '\x02':
        uVar2 = 1;
        goto LAB_0016c5ae;
      case '\x03':
        uVar2 = uVar15 - 1;
        iVar10 = uVar15 + 1;
        iVar13 = x;
        iVar8 = iVar14;
        uVar4 = uVar2;
        break;
      case '\x04':
        uVar2 = uVar15 - 1;
        iVar10 = uVar15 + 1;
        iVar12 = iVar18;
        uVar4 = uVar2;
        iVar3 = iVar14;
        break;
      case '\x05':
        uVar2 = uVar15 + 1;
        iVar10 = uVar15 - 1;
        iVar13 = iVar14;
        uVar4 = uVar2;
        break;
      case '\x06':
        iVar10 = uVar15 - 1;
        iVar8 = iVar18;
        iVar12 = x;
        uVar4 = uVar15 + 1;
        uVar19 = (ulong)(uVar15 + 1);
        iVar3 = iVar14;
        break;
      case '\a':
        uVar15 = 1;
        uVar4 = 1;
        if (uVar16 - 1 < 0x15 && x - 2U < 0x4f) {
          uVar4 = (uint)(*pcVar5 == '\x18' || *pcVar5 < '\x11');
        }
        if (lVar17 != 0x4f && uVar16 - 1 < 0x15) {
          uVar15 = (uint)(pcVar5[0x1f8] == '\x18' || pcVar5[0x1f8] < '\x11');
        }
        uVar7 = 1;
        uVar9 = 1;
        if (uVar16 != 0x14 && lVar17 != 0x4f) {
          uVar9 = (uint)(pcVar5[0x210] == '\x18' || pcVar5[0x210] < '\x11');
        }
        if (x - 2U < 0x4f && uVar16 != 0x14) {
          uVar7 = (uint)(pcVar5[0x18] == '\x18' || pcVar5[0x18] < '\x11');
        }
        uVar11 = uVar15 + uVar4 + uVar9;
        if (uVar7 + uVar11 < 2) {
          uVar2 = 1;
          if ((((uVar4 == 0) && (uVar2 = 2, uVar15 == 0)) && (uVar2 = 4, uVar9 == 0)) &&
             (uVar2 = uVar11, uVar7 != 0)) {
            uVar2 = 3;
          }
        }
        else if (((uVar4 == 0) || (uVar9 == 0)) || (uVar2 = 5, uVar7 != 0 || uVar15 != 0)) {
          uVar2 = 0;
          if (uVar9 == 0 && uVar4 == 0) {
            uVar2 = 6;
          }
          if (uVar7 == 0) {
            uVar2 = 0;
          }
          if (uVar15 == 0) {
            uVar2 = 0;
          }
        }
        goto LAB_0016c773;
      case '\b':
        uVar2 = uVar15 + 1;
        iVar10 = uVar15 - 1;
        iVar13 = iVar14;
        iVar12 = iVar10;
        goto LAB_0016c76a;
      case '\t':
        uVar2 = uVar15 - 1;
        iVar10 = uVar15 + 1;
        iVar3 = iVar14;
        iVar12 = iVar10;
        goto LAB_0016c76a;
      case '\n':
        iVar10 = uVar15 - 1;
        iVar13 = iVar14;
        iVar3 = iVar14;
        iVar8 = iVar18;
        iVar12 = uVar15 + 1;
        goto LAB_0016c76a;
      case '\v':
        iVar10 = uVar15 + 1;
        iVar8 = iVar14;
        iVar12 = uVar15 - 1;
LAB_0016c76a:
        uVar2 = set_twall(lev,iVar8,uVar2,iVar3,iVar10,iVar13,iVar12,(int)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffffa8);
        goto LAB_0016c773;
      default:
        goto switchD_0016c50c_caseD_c;
      case '\x0f':
        uVar2 = *(uint *)(pcVar5 + 0x10a) >> 9 & 1;
LAB_0016c5ae:
        in_stack_ffffffffffffffa0 = 0x16c5b3;
        uVar2 = set_wall(lev,x,uVar15,uVar2);
        goto LAB_0016c773;
      }
      uVar2 = set_corn(lev,iVar8,uVar2,iVar13,uVar4,iVar12,(int)uVar19,iVar3,iVar10);
LAB_0016c773:
      *(uint *)(pcVar5 + 0x10a) = *(uint *)(pcVar5 + 0x10a) & 0xffffff8f | (uVar2 & 0x1f) << 4;
switchD_0016c50c_caseD_c:
      uVar16 = uVar16 + 1;
      pcVar5 = pcVar5 + 0xc;
    } while (uVar16 != 0x15);
    pcVar6 = pcVar6 + 0xfc;
    lVar17 = lVar1;
    if (lVar1 == 0x50) {
      return;
    }
  } while( true );
}

Assistant:

void set_wall_state(struct level *lev)
{
    int x, y;
    int wmode;
    struct rm *loc;

    for (x = 0; x < COLNO; x++)
	for (loc = &lev->locations[x][0], y = 0; y < ROWNO; y++, loc++) {
	    switch (loc->typ) {
		case SDOOR:
		    wmode = set_wall(lev, x, y, (int) loc->horizontal);
		    break;
		case VWALL:
		    wmode = set_wall(lev, x, y, 0);
		    break;
		case HWALL:
		    wmode = set_wall(lev, x, y, 1);
		    break;
		case TDWALL:
		    wmode = set_twall(lev, x,y, x,y-1, x-1,y+1, x+1,y+1);
		    break;
		case TUWALL:
		    wmode = set_twall(lev, x,y, x,y+1, x+1,y-1, x-1,y-1);
		    break;
		case TLWALL:
		    wmode = set_twall(lev, x,y, x+1,y, x-1,y-1, x-1,y+1);
		    break;
		case TRWALL:
		    wmode = set_twall(lev, x,y, x-1,y, x+1,y+1, x+1,y-1);
		    break;
		case TLCORNER:
		    wmode = set_corn(lev, x-1,y-1, x,y-1, x-1,y, x+1,y+1);
		    break;
		case TRCORNER:
		    wmode = set_corn(lev, x,y-1, x+1,y-1, x+1,y, x-1,y+1);
		    break;
		case BLCORNER:
		    wmode = set_corn(lev, x,y+1, x-1,y+1, x-1,y, x+1,y-1);
		    break;
		case BRCORNER:
		    wmode = set_corn(lev, x+1,y, x+1,y+1, x,y+1, x-1,y-1);
		    break;
		case CROSSWALL:
		    wmode = set_crosswall(lev, x, y);
		    break;

		default:
		    wmode = -1;	/* don't set wall info */
		    break;
	    }

	if (wmode >= 0)
	    loc->wall_info = (loc->wall_info & ~WM_MASK) | wmode;
	}
}